

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O1

void PrintReturn(OutputContext *ctx,char *constantData,uint microcodePos)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  int *piVar6;
  char *format;
  
  uVar4 = (ulong)microcodePos;
  Print(ctx," (%d, %d) -> (",(ulong)*(uint *)(constantData + uVar4 * 4),
        (ulong)*(uint *)(constantData + uVar4 * 4 + 4));
  iVar3 = *(int *)(constantData + uVar4 * 4 + 8);
  if (iVar3 != 7) {
    piVar5 = (int *)(constantData + uVar4 * 4 + 8);
    do {
      switch(iVar3) {
      case 2:
        uVar4 = (ulong)(uint)piVar5[1];
        format = "r%d~";
        break;
      case 3:
        uVar4 = (ulong)(uint)piVar5[1];
        format = "r%d";
        break;
      case 4:
        uVar4 = (ulong)(uint)piVar5[1];
        format = "%d";
        break;
      case 5:
        uVar4 = (ulong)(uint)piVar5[1];
        format = "%dL";
        break;
      case 6:
        iVar3 = piVar5[1];
        piVar6 = piVar5 + 4;
        uVar1 = piVar5[2];
        uVar2 = piVar5[3];
        Print(ctx,"[");
        PrintRegister(ctx,(uchar)iVar3);
        Print(ctx," + 0x%x] x%d",(ulong)uVar1,(ulong)uVar2);
        goto LAB_0027c0da;
      default:
        __assert_fail("!\"unknown micro instruction\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                      ,0x11d,"void PrintReturn(OutputContext &, char *, unsigned int)");
      }
      piVar6 = piVar5 + 2;
      Print(ctx,format,uVar4);
LAB_0027c0da:
      if (*piVar6 != 7) {
        Print(ctx,", ");
      }
      iVar3 = *piVar6;
      piVar5 = piVar6;
    } while (iVar3 != 7);
  }
  Print(ctx,") @%d",(ulong)(microcodePos << 2));
  return;
}

Assistant:

void PrintReturn(OutputContext &ctx, char *constantData, unsigned microcodePos)
{
	unsigned *microcode = (unsigned*)constantData + microcodePos;

	unsigned typeId = *microcode++;
	unsigned typeSize = *microcode++;

	Print(ctx, " (%d, %d) -> (", typeId, typeSize);

	while(*microcode != rvmiReturn)
	{
		switch(*microcode++)
		{
		case rvmiPush:
			Print(ctx, "r%d~", *microcode++);
			break;
		case rvmiPushQword:
			Print(ctx, "r%d", *microcode++);
			break;
		case rvmiPushImm:
			Print(ctx, "%d", *microcode++);
			break;
		case rvmiPushImmq:
			Print(ctx, "%dL", *microcode++);
			break;
		case rvmiPushMem:
		{
			unsigned reg = *microcode++;
			unsigned offset = *microcode++;
			unsigned size = *microcode++;

			Print(ctx, "[");
			PrintRegister(ctx, (unsigned char)reg);
			Print(ctx, " + 0x%x] x%d", offset, size);
		}
		break;
		default:
			assert(!"unknown micro instruction");
		}

		if(*microcode != rvmiReturn)
			Print(ctx, ", ");
	}

	Print(ctx, ") @%d", microcodePos * 4);
}